

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

Optimizer * __thiscall spvtools::Optimizer::RegisterPass(Optimizer *this,PassToken *p)

{
  unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_> *puVar1;
  pointer this_00;
  MessageConsumer *__x;
  pointer pIVar2;
  unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_> local_40;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> local_38;
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  *local_18;
  PassToken *p_local;
  Optimizer *this_local;
  
  local_18 = &p->impl_;
  p_local = (PassToken *)this;
  puVar1 = &std::
            unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            ::operator->(&p->impl_)->pass;
  this_00 = std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>::
            operator->(puVar1);
  __x = consumer(this);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function(&local_38,__x);
  opt::Pass::SetMessageConsumer(this_00,&local_38);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  ~function(&local_38);
  pIVar2 = std::
           unique_ptr<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>::
           operator->(&this->impl_);
  puVar1 = &std::
            unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            ::operator->(local_18)->pass;
  std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>::unique_ptr
            (&local_40,puVar1);
  opt::PassManager::AddPass(&pIVar2->pass_manager,&local_40);
  std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>::~unique_ptr
            (&local_40);
  return this;
}

Assistant:

Optimizer& Optimizer::RegisterPass(PassToken&& p) {
  // Change to use the pass manager's consumer.
  p.impl_->pass->SetMessageConsumer(consumer());
  impl_->pass_manager.AddPass(std::move(p.impl_->pass));
  return *this;
}